

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_adaptive_eval_grid.h
# Opt level: O2

bool embree::sse2::
     stitch_col<embree::sse2::FeatureAdaptiveEvalGrid,embree::GeneralCatmullClarkPatchT<embree::Vec3fa,embree::Vec3fa>>
               (GeneralCatmullClarkPatchT<embree::Vec3fa,_embree::Vec3fa> *patch,int subPatch,
               bool right,uint y0,uint y1,int fine_y,int coarse_y,float *Px,float *Py,float *Pz,
               float *U,float *V,float *Nx,float *Ny,float *Nz,uint dx0,uint dwidth,uint dheight)

{
  size_t size;
  int iVar1;
  float *Ny_00;
  float *Nx_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  float *Nz_00;
  uint y0_00;
  StackArray<float,_256UL> py;
  StackArray<float,_256UL> px;
  StackArray<float,_256UL> ny;
  StackArray<float,_256UL> nx;
  StackArray<float,_256UL> v;
  StackArray<float,_256UL> u;
  StackArray<float,_256UL> pz;
  StackArray<float,_256UL> nz;
  float local_b00 [64];
  float *local_a00;
  ulong local_9f8;
  float local_9c0 [64];
  float *local_8c0;
  ulong local_8b8;
  float local_880 [64];
  float *local_780;
  ulong local_778;
  float local_740 [64];
  float *local_640;
  ulong local_638;
  float local_600 [64];
  float *local_500;
  ulong local_4f8;
  float local_4c0 [64];
  float *local_3c0;
  ulong local_3b8;
  float local_380 [64];
  float *local_280;
  ulong local_278;
  float local_240 [64];
  float *local_140;
  ulong local_138;
  FeatureAdaptiveEvalGrid local_e0;
  
  if (fine_y != coarse_y) {
    iVar2 = (y0 * 2 + 1) * coarse_y;
    iVar1 = fine_y * 2;
    y0_00 = iVar2 / iVar1;
    uVar3 = (int)((y1 * 2 + 1) * coarse_y) / iVar1;
    uVar4 = (uVar3 - y0_00) + 5;
    local_9f8 = (ulong)uVar4;
    local_8c0 = local_9c0;
    local_a00 = local_b00;
    local_8b8 = local_9f8;
    local_778 = local_9f8;
    local_638 = local_9f8;
    local_4f8 = local_9f8;
    local_3b8 = local_9f8;
    local_278 = local_9f8;
    local_138 = local_9f8;
    if (uVar4 < 0x41) {
      local_280 = local_380;
      local_3c0 = local_4c0;
      local_500 = local_600;
      local_640 = local_740;
      local_780 = local_880;
      local_140 = local_240;
    }
    else {
      size = local_9f8 * 4;
      local_8c0 = (float *)alignedMalloc(size,0x40);
      local_a00 = (float *)alignedMalloc(size,0x40);
      local_280 = (float *)alignedMalloc(size,0x40);
      local_3c0 = (float *)alignedMalloc(size,0x40);
      local_500 = (float *)alignedMalloc(size,0x40);
      local_640 = (float *)alignedMalloc(size,0x40);
      local_780 = (float *)alignedMalloc(size,0x40);
      local_140 = (float *)alignedMalloc(size,0x40);
    }
    Nz_00 = local_140;
    Ny_00 = local_780;
    Nx_00 = local_640;
    if (Nx == (float *)0x0) {
      Nz_00 = (float *)0x0;
      Ny_00 = (float *)0x0;
      Nx_00 = (float *)0x0;
    }
    FeatureAdaptiveEvalGrid::FeatureAdaptiveEvalGrid
              (&local_e0,patch,subPatch,(uint)right,(uint)right,y0_00,uVar3,2,coarse_y + 1,local_8c0
               ,local_a00,local_280,local_3c0,local_500,Nx_00,Ny_00,Nz_00,1,0x1001);
    for (; y0 <= y1; y0 = y0 + 1) {
      uVar3 = iVar2 / iVar1 - y0_00;
      Px[dx0] = local_8c0[uVar3];
      Py[dx0] = local_a00[uVar3];
      Pz[dx0] = local_280[uVar3];
      U[dx0] = local_3c0[uVar3];
      V[dx0] = local_500[uVar3];
      if (Nx != (float *)0x0) {
        Nx[dx0] = local_640[uVar3];
        Ny[dx0] = local_780[uVar3];
        Nz[dx0] = local_140[uVar3];
      }
      iVar2 = iVar2 + coarse_y * 2;
      dx0 = dx0 + dwidth;
    }
    if (local_140 != local_240) {
      alignedFree(local_140);
    }
    if (local_780 != local_880) {
      alignedFree(local_780);
    }
    if (local_640 != local_740) {
      alignedFree(local_640);
    }
    if (local_500 != local_600) {
      alignedFree(local_500);
    }
    if (local_3c0 != local_4c0) {
      alignedFree(local_3c0);
    }
    if (local_280 != local_380) {
      alignedFree(local_280);
    }
    if (local_a00 != local_b00) {
      alignedFree(local_a00);
    }
    if (local_8c0 != local_9c0) {
      alignedFree(local_8c0);
    }
  }
  return fine_y != coarse_y;
}

Assistant:

bool stitch_col(const Patch& patch, int subPatch,
                      const bool right, const unsigned y0, const unsigned y1, const int fine_y, const int coarse_y, 
                      float* Px, float* Py, float* Pz, float* U, float* V, float* Nx, float* Ny, float* Nz, const unsigned dx0, const unsigned dwidth, const unsigned dheight)
    {
      assert(coarse_y <= fine_y);
      if (likely(fine_y == coarse_y))
        return false;
      
      const unsigned y0s = stitch(y0,fine_y,coarse_y);
      const unsigned y1s = stitch(y1,fine_y,coarse_y);
      const unsigned M = y1s-y0s+1 + VSIZEX;
      
      dynamic_large_stack_array(float,px,M,64*sizeof(float));
      dynamic_large_stack_array(float,py,M,64*sizeof(float));
      dynamic_large_stack_array(float,pz,M,64*sizeof(float));
      dynamic_large_stack_array(float,u,M,64*sizeof(float));
      dynamic_large_stack_array(float,v,M,64*sizeof(float));
      dynamic_large_stack_array(float,nx,M,64*sizeof(float));
      dynamic_large_stack_array(float,ny,M,64*sizeof(float));
      dynamic_large_stack_array(float,nz,M,64*sizeof(float));
      const bool has_Nxyz = Nx; assert(!Nx || (Ny && Nz));
      Eval(patch,subPatch, right,right, y0s,y1s, 2,coarse_y+1, px,py,pz,u,v, 
           has_Nxyz ? (float*)nx : nullptr,has_Nxyz ? (float*)ny : nullptr ,has_Nxyz ? (float*)nz : nullptr, 1,4097);
      
      for (unsigned y=y0; y<=y1; y++) 
      {
        const unsigned ys = stitch(y,fine_y,coarse_y)-y0s;
        Px[(y-y0)*dwidth+dx0] = px[ys];
        Py[(y-y0)*dwidth+dx0] = py[ys];
        Pz[(y-y0)*dwidth+dx0] = pz[ys];
        U [(y-y0)*dwidth+dx0] = u[ys];
        V [(y-y0)*dwidth+dx0] = v[ys];
        if (unlikely(has_Nxyz)) {
          Nx[(y-y0)*dwidth+dx0] = nx[ys];
          Ny[(y-y0)*dwidth+dx0] = ny[ys];
          Nz[(y-y0)*dwidth+dx0] = nz[ys];
        }
      }
      return true;
    }